

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  pthread_mutex_t *ppVar2;
  uint64_t uVar3;
  atomic<unsigned_long> aVar4;
  unsigned_long uVar5;
  pointer pRVar6;
  pointer pRVar7;
  bool bVar8;
  cx_string<2UL> cVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  long *plVar13;
  size_t sVar14;
  SessionWriter *pSVar15;
  __atomic_base<unsigned_long> _Var16;
  Session *pSVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  char *pcVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  __normal_iterator<RecoveredBuffer_*,_std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>_>
  __i;
  string *this;
  long lVar24;
  long *in_FS_OFFSET;
  timespec ts_1;
  size_t size;
  streamoff afterMagicPos;
  vector<char,_std::allocator<char>_> metadata;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> buffers;
  uintptr_t session;
  void *sessionptr;
  size_t offset;
  array<unsigned_char,_8UL> dataMagic;
  array<unsigned_char,_8UL> metadataMagic;
  string outputPath;
  ofstream outputFile;
  ifstream input;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1278;
  pointer local_1268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1248;
  undefined8 local_1240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1228;
  undefined8 local_1220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1218;
  _Alloc_hider local_1208;
  size_type local_1200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11f8;
  undefined8 local_11e8;
  _Alloc_hider local_11e0;
  size_type local_11d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_11c0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_11b0;
  SessionWriter *local_1198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1168;
  unsigned_long local_1160;
  cx_string<1UL> local_1154;
  cx_string<1UL> local_1152;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10f8;
  long local_10f0;
  vector<char,_std::allocator<char>_> local_10e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_10a0;
  string *local_1098;
  undefined1 *local_1090;
  char *local_1088;
  char *local_1080;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1078;
  undefined4 local_1070;
  undefined4 uStack_106c;
  vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> local_1068;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1048;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1040;
  code *local_1038;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1030;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1020;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1010 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1000;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_ff0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fe0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_fd0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_fc0;
  undefined8 local_fb0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_fa8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f78;
  undefined1 local_f68 [152];
  _Alloc_hider local_ed0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ec0;
  undefined1 local_eb0 [16];
  _Alloc_hider local_ea0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e90;
  _Alloc_hider local_e80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e70;
  _Alloc_hider local_e60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e50;
  uint64_t local_e40;
  _Alloc_hider local_e38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e08;
  undefined1 local_df8 [16];
  _Alloc_hider local_de8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dd8;
  _Alloc_hider local_dc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_db8;
  _Alloc_hider local_da8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d98;
  uint64_t local_d88;
  _Alloc_hider local_d80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d70;
  _Alloc_hider local_d60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d50;
  undefined1 local_d40 [16];
  _Alloc_hider local_d30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d20;
  _Alloc_hider local_d10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d00;
  _Alloc_hider local_cf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ce0;
  uint64_t local_cd0;
  _Alloc_hider local_cc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ca8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c98;
  undefined1 local_c88 [16];
  _Alloc_hider local_c78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  _Alloc_hider local_c58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c48;
  _Alloc_hider local_c38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c28;
  uint64_t local_c18;
  _Alloc_hider local_c10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_be0;
  undefined1 local_bd0 [16];
  _Alloc_hider local_bc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_bb0;
  _Alloc_hider local_ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b90;
  _Alloc_hider local_b80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b70;
  uint64_t local_b60;
  _Alloc_hider local_b58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  undefined1 local_b18 [152];
  _Alloc_hider local_a80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a70;
  undefined1 *local_a60;
  undefined1 *local_a58;
  undefined1 *local_a50;
  string *local_a48;
  string *local_a40;
  string *local_a38;
  string *local_a30;
  long local_a28;
  long local_a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a18 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9f8 [4];
  undefined1 local_9b8 [40];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  long *local_960 [2];
  long local_950 [2];
  undefined1 local_940 [16];
  _Alloc_hider local_930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  _Alloc_hider local_910;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_900;
  _Alloc_hider local_8f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8e0;
  uint64_t local_8d0;
  _Alloc_hider local_8c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  _Alloc_hider local_8a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_898;
  undefined1 local_888 [16];
  _Alloc_hider local_878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_868;
  _Alloc_hider local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_848;
  _Alloc_hider local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  uint64_t local_818;
  _Alloc_hider local_810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  _Alloc_hider local_7f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  undefined1 local_7d0 [16];
  _Alloc_hider local_7c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7b0;
  _Alloc_hider local_7a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_790;
  _Alloc_hider local_780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_770;
  uint64_t local_760;
  _Alloc_hider local_758;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_748;
  _Alloc_hider local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  undefined1 local_718 [16];
  _Alloc_hider local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  _Alloc_hider local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d8;
  _Alloc_hider local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b8;
  uint64_t local_6a8;
  _Alloc_hider local_6a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  _Alloc_hider local_680;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  undefined1 local_660 [16];
  _Alloc_hider local_650;
  char local_640 [16];
  _Alloc_hider local_630;
  char local_620 [16];
  _Alloc_hider local_610;
  char local_600 [16];
  uint64_t local_5f0;
  _Alloc_hider local_5e8;
  char local_5d8 [16];
  _Alloc_hider local_5c8;
  char local_5b8 [16];
  undefined1 local_5a8 [16];
  _Alloc_hider local_598;
  char local_588 [16];
  _Alloc_hider local_578;
  char local_568 [16];
  _Alloc_hider local_558;
  char local_548 [16];
  uint64_t local_538;
  _Alloc_hider local_530;
  char local_520 [16];
  _Alloc_hider local_510;
  char local_500 [16];
  undefined1 local_4f0 [16];
  _Alloc_hider local_4e0;
  char local_4d0 [16];
  _Alloc_hider local_4c0;
  char local_4b0 [16];
  _Alloc_hider local_4a0;
  char local_490 [16];
  uint64_t local_480;
  _Alloc_hider local_478;
  char local_468 [16];
  _Alloc_hider local_458;
  char local_448 [16];
  undefined1 local_438 [8];
  size_type sStack_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  undefined1 local_418 [216];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
               ,0x2cd);
    return 1;
  }
  std::ifstream::ifstream((istream *)local_238,argv[1],_S_in|_S_bin);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar17 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)local_438);
      if (local_438 != (undefined1  [8])&local_428) {
        operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    lVar20 = *in_FS_OFFSET;
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
      if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)local_438
                    );
          if (local_438 != (undefined1  [8])&local_428) {
            operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_7d0._0_8_ = 0;
        local_7d0._8_2_ = error;
        local_7c0._M_p = (pointer)&local_7b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"main","");
        local_7a0._M_p = (pointer)&local_790;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"main","");
        local_780._M_p = (pointer)&local_770;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_780,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_760 = 0xfe;
        local_758._M_p = (pointer)&local_748;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_758,"Failed to open {} for reading","");
        local_1258._M_allocated_capacity._0_2_ = 0x5b;
        local_a18[0]._M_allocated_capacity._0_2_ = 99;
        cVar9 = mserialize::cx_strcat<1ul,1ul>
                          ((cx_string<1UL> *)&local_1258,(cx_string<1UL> *)local_a18);
        local_438 = (undefined1  [8])(CONCAT53(local_438._3_5_,cVar9._data) & 0xffffffffff00ffff);
        local_738._M_p = (pointer)&local_728;
        sVar12 = strlen(local_438);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_738,local_438,local_438 + sVar12);
        iVar10 = pthread_mutex_lock(ppVar2);
        if (iVar10 != 0) goto LAB_00108665;
        local_7d0._0_8_ = ppVar2[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_7d0,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
        _Var16._M_i = ppVar2[3].__align;
        ppVar2[3].__align = _Var16._M_i + 1;
        pthread_mutex_unlock(ppVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_p != &local_728) {
          operator_delete(local_738._M_p,local_728._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_p != &local_748) {
          operator_delete(local_758._M_p,local_748._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_p != &local_770) {
          operator_delete(local_780._M_p,local_770._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a0._M_p != &local_790) {
          operator_delete(local_7a0._M_p,local_790._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c0._M_p != &local_7b0) {
          operator_delete(local_7c0._M_p,local_7b0._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
      }
      aVar4.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)local_438);
        if (local_438 != (undefined1  [8])&local_428) {
          operator_delete((void *)local_438,local_428._M_allocated_capacity + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_438 = (undefined1  [8])0x0;
      sStack_430 = 0;
      clock_gettime(0,(timespec *)local_438);
      binlog::SessionWriter::addEvent<char_const*&>
                ((SessionWriter *)(lVar20 + -0x38),
                 (uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                 (long)local_438 * 1000000000 + sStack_430,argv + 1);
    }
    anon_unknown.dwarf_1ed09::printLogs();
    iVar11 = 2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
               ,0x2cd);
    goto LAB_00107d4b;
  }
  if (argc == 2) {
    pcVar21 = "-";
  }
  else {
    pcVar21 = argv[2];
  }
  std::__cxx11::string::string((string *)local_960,pcVar21,(allocator *)local_438);
  this = (string *)local_438;
  std::ofstream::ofstream(this);
  iVar10 = std::__cxx11::string::compare((char *)local_960);
  if (iVar10 == 0) {
    this = (string *)&std::cout;
    local_1038 = std::ostream::write;
  }
  else {
    std::ofstream::open(this,(_Ios_Openmode)local_960);
    local_1038 = (code *)local_418;
  }
  local_1098 = this;
  if (((byte)this[*(long *)(*(long *)this + -0x18) + 0x20] & 5) == 0) {
    local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a20 = -0x1deb08d91ca4244;
    local_a28 = -0x1dec08e92cb4344;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar17 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)&local_1258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           **)local_1258._M_allocated_capacity != &local_1248) {
        operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_1198 = (SessionWriter *)(*in_FS_OFFSET + -0x38);
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                     (string *)&local_1258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_940._0_8_ = 0;
        local_940._8_2_ = info;
        local_930._M_p = (pointer)&local_920;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"main","");
        local_910._M_p = (pointer)&local_900;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"main","");
        local_8f0._M_p = (pointer)&local_8e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_8d0 = 0x117;
        local_8c8._M_p = (pointer)&local_8b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8c8,"Read input from {}","");
        local_a18[0]._M_allocated_capacity._0_2_ = 0x5b;
        local_f68._0_2_ = 99;
        cVar9 = mserialize::cx_strcat<1ul,1ul>
                          ((cx_string<1UL> *)local_a18,(cx_string<1UL> *)local_f68);
        local_1258._M_allocated_capacity =
             CONCAT53(local_1258._M_allocated_capacity._3_5_,cVar9._data) & 0xffffffffff00ffff;
        local_8a8._M_p = (pointer)&local_898;
        sVar12 = strlen(local_1258._M_local_buf);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_8a8,&local_1258,local_1258._M_local_buf + sVar12);
        iVar10 = pthread_mutex_lock(ppVar2);
        if (iVar10 != 0) goto LAB_00108688;
        local_940._0_8_ = ppVar2[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_940,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
        _Var16._M_i = ppVar2[3].__align;
        ppVar2[3].__align = _Var16._M_i + 1;
        pthread_mutex_unlock(ppVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_p != &local_898) {
          operator_delete(local_8a8._M_p,local_898._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c8._M_p != &local_8b8) {
          operator_delete(local_8c8._M_p,local_8b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8f0._M_p != &local_8e0) {
          operator_delete(local_8f0._M_p,local_8e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_910._M_p != &local_900) {
          operator_delete(local_910._M_p,local_900._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_930._M_p != &local_920) {
          operator_delete(local_930._M_p,local_920._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
      }
      aVar4.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)&local_1258
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1258._M_allocated_capacity != &local_1248) {
          operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_1258._M_allocated_capacity = 0;
      local_1258._8_8_ = 0;
      clock_gettime(0,(timespec *)&local_1258);
      binlog::SessionWriter::addEvent<char_const*&>
                (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                 local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_,argv + 1);
    }
    anon_unknown.dwarf_1ed09::printLogs();
    local_1110 = &local_cb8;
    local_1180 = &local_d70;
    local_10a0 = &local_b48;
    name = local_a18;
    local_a50 = local_990;
    local_1080 = local_f68 + 0x88;
    local_1088 = local_b18 + 0x88;
    local_1190 = &local_11d0;
    local_1100 = &local_c00;
    local_1178 = &local_ca8;
    local_a38 = (string *)&local_d60;
    local_1078 = &local_b38;
    local_a58 = local_980;
    local_a40 = (string *)&local_ed0;
    local_a48 = (string *)&local_a80;
    local_a30 = (string *)local_11c0;
    local_1168 = &local_bf0;
    local_10a8 = &local_c98;
    local_1170 = &local_d50;
    local_10f8 = &local_b28;
    local_a60 = local_970;
    local_1040 = &local_ec0;
    local_1048 = &local_a70;
    local_1188 = &local_11b0;
    local_1108 = &local_be0;
    local_1148 = &local_d20;
    local_1128 = &local_d00;
    local_10c0 = &local_ce0;
    local_1150 = &local_dd8;
    local_1130 = &local_db8;
    local_10c8 = &local_d98;
    local_1118 = &local_b90;
    local_10b0 = &local_b70;
    local_10d0 = local_a18 + 2;
    local_1090 = local_9b8;
    local_1140 = &local_c68;
    local_1120 = &local_c48;
    local_10b8 = &local_c28;
    local_1138 = &local_bb0;
    while (plVar13 = (long *)std::istream::ignore((long)local_238,-1),
          *(int *)((long)plVar13 + *(long *)(*plVar13 + -0x18) + 0x20) == 0) {
      local_1070 = 0xbc;
      uStack_106c = 0;
      std::istream::read((char *)local_238,(long)&local_1070 + 1);
      local_10f0 = std::istream::tellg();
      iVar10 = (int)(istream *)local_238;
      if (CONCAT44(uStack_106c,local_1070) == local_a20) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = &local_1258;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              name = &local_1258;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_1258._M_allocated_capacity != &local_1248) {
                operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_bd0._0_8_ = 0;
            local_bd0._8_2_ = info;
            local_bc0._M_p = (pointer)&local_bb0;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_bc0,"main","");
            local_ba0._M_p = (pointer)&local_b90;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba0,"main","");
            local_b80._M_p = (pointer)&local_b70;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b80,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,"");
            local_b60 = 0x122;
            local_b58._M_p = (pointer)local_10a0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b58,"Magic number found, read metadata at tellg={}","");
            local_1258._M_allocated_capacity._0_2_ = 0x6c;
            local_b38._M_allocated_capacity = (size_type)local_10f8;
            sVar12 = strlen(local_1258._M_local_buf);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1078,&local_1258,local_1258._M_local_buf + sVar12);
            iVar11 = pthread_mutex_lock(ppVar2);
            if (iVar11 != 0) {
              iVar10 = std::__throw_system_error(iVar11);
              goto LAB_00108642;
            }
            local_bd0._0_8_ = ppVar2[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_bd0,
                       (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
            _Var16._M_i = ppVar2[3].__align;
            ppVar2[3].__align = _Var16._M_i + 1;
            pthread_mutex_unlock(ppVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b38._M_allocated_capacity != local_10f8) {
              operator_delete((void *)local_b38._M_allocated_capacity,
                              local_b28._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b58._M_p != local_10a0) {
              operator_delete(local_b58._M_p,local_b48._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b80._M_p != &local_b70) {
              operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ba0._M_p != &local_b90) {
              operator_delete(local_ba0._M_p,local_b90._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_bc0._M_p != &local_bb0) {
              operator_delete(local_bc0._M_p,local_bb0._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
          }
          aVar4.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            name = &local_1258;
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_1258._M_allocated_capacity != &local_1248) {
              operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_1258._M_allocated_capacity = 0;
          local_1258._8_8_ = 0;
          clock_gettime(0,(timespec *)&local_1258);
          binlog::SessionWriter::addEvent<long_const&>
                    (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                     local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_,&local_10f0);
        }
        anon_unknown.dwarf_1ed09::printLogs();
        local_1030._8_8_ = 0;
        std::istream::read((char *)local_238,(long)&local_1030 + 8);
        local_1030._M_allocated_capacity = local_1030._8_8_;
        local_1160 = 0;
        std::istream::read((char *)local_238,(long)&local_1160);
        uVar5 = local_1160;
        sVar14 = anon_unknown.dwarf_1ed09::remainingSize((istream *)local_238);
        if (sVar14 < uVar5) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = &local_1288;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1288._M_allocated_capacity != &local_1278) {
              operator_delete((void *)local_1288._M_allocated_capacity,
                              (ulong)(local_1278._M_allocated_capacity + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar17 = binlog::default_session();
                binlog::detail::this_thread_id_string_abi_cxx11_();
                name = &local_1288;
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                           (string *)name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1288._M_allocated_capacity != &local_1278) {
                  operator_delete((void *)local_1288._M_allocated_capacity,
                                  (ulong)(local_1278._M_allocated_capacity + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_1258._M_allocated_capacity = 0;
              local_1258._8_2_ = 0x200;
              local_1248 = &local_1238;
              local_1238._M_allocated_capacity._0_4_ = 0x6e69616d;
              local_1240 = 4;
              local_1238._M_allocated_capacity._4_4_ =
                   local_1238._M_allocated_capacity._4_4_ & 0xffffff00;
              local_1228 = &local_1218;
              local_1218._M_allocated_capacity = 0x6174654d64616572;
              local_1218._8_4_ = 0x61746164;
              local_1220 = 0xc;
              local_1218._M_local_buf[0xc] = '\0';
              local_1208._M_p = (pointer)&local_11f8;
              local_1288._M_allocated_capacity = 0x5a;
              local_1208._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_1208,(ulong)&local_1288)
              ;
              uVar18 = local_1288._M_allocated_capacity;
              local_11f8._M_allocated_capacity = local_1288._M_allocated_capacity;
              memcpy(local_1208._M_p,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,0x5a);
              local_1200 = uVar18;
              local_1208._M_p[uVar18] = '\0';
              local_11e8 = 0x82;
              local_11e0._M_p = (pointer)local_1190;
              local_1288._M_allocated_capacity = 0x1d;
              local_11e0._M_p =
                   (pointer)std::__cxx11::string::_M_create((ulong *)&local_11e0,(ulong)&local_1288)
              ;
              local_11d0._M_allocated_capacity = local_1288._M_allocated_capacity;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xd) = '\'';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xe) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xf) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x10) = 'h';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x11) = 'a';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x12) = 'v';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x13) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x14) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x15) = '{';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x16) = '}';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x17) = ' ';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x18) = 'b';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x19) = 'y';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x1a) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x1b) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0x1c) = 's';
              *(undefined8 *)local_11e0._M_p = 0x207475706e492020;
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 8) = 'd';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 9) = 'o';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 10) = 'e';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xb) = 's';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xc) = 'n';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xd) = '\'';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xe) = 't';
              *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_11e0._M_p + 0xf) = ' ';
              local_11d8 = local_1288._M_allocated_capacity;
              local_11e0._M_p[local_1288._M_allocated_capacity] = '\0';
              local_1288._M_allocated_capacity._0_2_ = 0x4c;
              local_11c0[0] = local_1188;
              sVar12 = strlen((char *)&local_1288);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_a30,(cx_string<2UL> *)&local_1288,
                         (long)((cx_string<2UL> *)&local_1288)->_data + sVar12);
              iVar11 = pthread_mutex_lock(ppVar2);
              if (iVar11 != 0) goto LAB_0010865e;
              local_1258._M_allocated_capacity = ppVar2[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)&local_1258,
                         (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
              uVar3 = ppVar2[3].__align;
              ppVar2[3].__align = uVar3 + 1;
              pthread_mutex_unlock(ppVar2);
              if (local_11c0[0] != local_1188) {
                operator_delete(local_11c0[0],local_11b0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_11e0._M_p != local_1190) {
                operator_delete(local_11e0._M_p,local_11d0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1208._M_p != &local_11f8) {
                operator_delete(local_1208._M_p,local_11f8._M_allocated_capacity + 1);
              }
              if (local_1228 != &local_1218) {
                operator_delete(local_1228,local_1218._M_allocated_capacity + 1);
              }
              if (local_1248 != &local_1238) {
                operator_delete(local_1248,
                                CONCAT44(local_1238._M_allocated_capacity._4_4_,
                                         local_1238._M_allocated_capacity._0_4_) + 1);
              }
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
                   = uVar3;
            }
            uVar3 = 
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_0
            ;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              name = &local_1288;
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1288._M_allocated_capacity != &local_1278) {
                operator_delete((void *)local_1288._M_allocated_capacity,
                                (ulong)(local_1278._M_allocated_capacity + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1288._M_allocated_capacity = 0;
            local_1288._8_8_ = 0;
            clock_gettime(0,(timespec *)&local_1288);
            binlog::SessionWriter::addEvent<unsigned_long&>
                      (local_1198,uVar3,
                       local_1288._M_allocated_capacity * 1000000000 + local_1288._8_8_,&local_1160)
            ;
          }
          anon_unknown.dwarf_1ed09::printLogs();
          goto LAB_00106690;
        }
        local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        paVar22 = &local_1288;
        std::vector<char,_std::allocator<char>_>::resize(&local_10e8,local_1160);
        std::istream::read((char *)local_238,
                           (long)local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)paVar22
                      );
            name = paVar22;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1288._M_allocated_capacity != &local_1278) {
              operator_delete((void *)local_1288._M_allocated_capacity,
                              (ulong)(local_1278._M_allocated_capacity + 1));
              name = paVar22;
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
                == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar17 = binlog::default_session();
                name = &local_1288;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                           (string *)name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1288._M_allocated_capacity != &local_1278) {
                  operator_delete((void *)local_1288._M_allocated_capacity,
                                  (ulong)(local_1278._M_allocated_capacity + 1));
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_f68._0_8_ = 0;
              local_f68._8_2_ = error;
              local_f68._16_8_ = local_f68 + 0x20;
              local_f68._32_4_ = 0x6e69616d;
              local_f68._24_8_ = 4;
              local_f68._36_4_ = local_f68._36_4_ & 0xffffff00;
              local_f68._48_8_ = local_f68 + 0x40;
              local_f68._64_8_ = 0x6174654d64616572;
              local_f68._72_4_ = 0x61746164;
              local_f68._56_8_ = 0xc;
              local_f68[0x4c] = '\0';
              local_f68._80_8_ = local_f68 + 0x60;
              local_1288._M_allocated_capacity = 0x5a;
              local_f68._80_8_ =
                   std::__cxx11::string::_M_create((ulong *)(local_f68 + 0x50),(ulong)&local_1288);
              uVar18 = local_1288._M_allocated_capacity;
              local_f68._96_8_ = local_1288._M_allocated_capacity;
              memcpy((void *)local_f68._80_8_,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,0x5a);
              local_f68._88_8_ = uVar18;
              *(char *)(local_f68._80_8_ + uVar18) = '\0';
              local_f68._112_8_ = 0x94;
              local_f68._120_8_ = local_1080;
              local_1288._M_allocated_capacity = 0x30;
              local_f68._120_8_ =
                   std::__cxx11::string::_M_create((ulong *)(local_f68 + 0x78),(ulong)&local_1288);
              local_f68._136_8_ = local_1288._M_allocated_capacity;
              builtin_strncpy((char *)local_f68._120_8_,
                              "  Failed to read {} bytes of metadata from input",0x30);
              local_f68._128_8_ = local_1288._M_allocated_capacity;
              *(char *)(local_f68._120_8_ + local_1288._M_allocated_capacity) = '\0';
              local_1288._M_allocated_capacity._0_2_ = 0x4c;
              local_ed0._M_p = (pointer)local_1040;
              sVar12 = strlen((char *)&local_1288);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_a40,(cx_string<2UL> *)&local_1288,
                         (long)((cx_string<2UL> *)&local_1288)->_data + sVar12);
              iVar11 = pthread_mutex_lock(ppVar2);
              if (iVar11 != 0) goto LAB_00108673;
              local_f68._0_8_ = ppVar2[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_f68,
                         (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
              uVar3 = ppVar2[3].__align;
              ppVar2[3].__align = uVar3 + 1;
              pthread_mutex_unlock(ppVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ed0._M_p != local_1040) {
                operator_delete(local_ed0._M_p,local_ec0._M_allocated_capacity + 1);
              }
              if ((char *)local_f68._120_8_ != local_1080) {
                operator_delete((void *)local_f68._120_8_,local_f68._136_8_ + 1);
              }
              if ((undefined1 *)local_f68._80_8_ != local_f68 + 0x60) {
                operator_delete((void *)local_f68._80_8_,local_f68._96_8_ + 1);
              }
              if ((undefined1 *)local_f68._48_8_ != local_f68 + 0x40) {
                operator_delete((void *)local_f68._48_8_,local_f68._64_8_ + 1);
              }
              if ((undefined1 *)local_f68._16_8_ != local_f68 + 0x20) {
                operator_delete((void *)local_f68._16_8_,
                                CONCAT44(local_f68._36_4_,local_f68._32_4_) + 1);
              }
              LOCK();
              UNLOCK();
              _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
                   = uVar3;
            }
            uVar3 = 
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_1_0
            ;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              name = &local_1288;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1288._M_allocated_capacity != &local_1278) {
                operator_delete((void *)local_1288._M_allocated_capacity,
                                (ulong)(local_1278._M_allocated_capacity + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1288._M_allocated_capacity = 0;
            local_1288._8_8_ = 0;
            clock_gettime(0,(timespec *)&local_1288);
            binlog::SessionWriter::addEvent<unsigned_long&>
                      (local_1198,uVar3,
                       local_1288._M_allocated_capacity * 1000000000 + local_1288._8_8_,&local_1160)
            ;
          }
          anon_unknown.dwarf_1ed09::printLogs();
LAB_00106669:
          bVar8 = false;
          goto LAB_0010666b;
        }
        bVar8 = anon_unknown.dwarf_1ed09::checkEntryBuffer(&local_10e8);
        if (!bVar8) goto LAB_00106669;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)paVar22);
          name = paVar22;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1288._M_allocated_capacity != &local_1278) {
            operator_delete((void *)local_1288._M_allocated_capacity,
                            (ulong)(local_1278._M_allocated_capacity + 1));
            name = paVar22;
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (_ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
              == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                         (string *)&local_1288);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1288._M_allocated_capacity != &local_1278) {
                operator_delete((void *)local_1288._M_allocated_capacity,
                                (ulong)(local_1278._M_allocated_capacity + 1));
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_b18._0_8_ = 0;
            local_b18._8_2_ = info;
            local_b18._16_8_ = local_b18 + 0x20;
            local_b18._32_4_ = 0x6e69616d;
            local_b18._24_8_ = 4;
            local_b18._36_4_ = local_b18._36_4_ & 0xffffff00;
            local_b18._48_8_ = local_b18 + 0x40;
            local_b18._64_8_ = 0x6174654d64616572;
            local_b18._72_4_ = 0x61746164;
            local_b18._56_8_ = 0xc;
            local_b18[0x4c] = '\0';
            local_b18._80_8_ = local_b18 + 0x60;
            local_1288._M_allocated_capacity = 0x5a;
            local_b18._80_8_ =
                 std::__cxx11::string::_M_create((ulong *)(local_b18 + 0x50),(ulong)&local_1288);
            uVar18 = local_1288._M_allocated_capacity;
            local_b18._96_8_ = local_1288._M_allocated_capacity;
            memcpy((void *)local_b18._80_8_,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,0x5a);
            local_b18._88_8_ = uVar18;
            *(char *)(local_b18._80_8_ + uVar18) = '\0';
            local_b18._112_8_ = 0x9a;
            local_b18._120_8_ = local_1088;
            local_1288._M_allocated_capacity = 0x30;
            local_b18._120_8_ =
                 std::__cxx11::string::_M_create((ulong *)(local_b18 + 0x78),(ulong)&local_1288);
            local_b18._136_8_ = local_1288._M_allocated_capacity;
            builtin_strncpy((char *)local_b18._120_8_,
                            "  Recovered {} bytes of metadata from session={}",0x30);
            local_b18._128_8_ = local_1288._M_allocated_capacity;
            *(char *)(local_b18._120_8_ + local_1288._M_allocated_capacity) = '\0';
            local_1152._data[0] = 'L';
            local_1152._data[1] = '\0';
            local_1154._data[0] = 'L';
            local_1154._data[1] = '\0';
            cVar9 = mserialize::cx_strcat<1ul,1ul>(&local_1152,&local_1154);
            local_1288._M_local_buf[0] = cVar9._data[0];
            local_1288._M_local_buf[1] = cVar9._data[1];
            local_1288._M_local_buf[2] = cVar9._data[2];
            local_a80._M_p = (pointer)local_1048;
            sVar12 = strlen((char *)&local_1288);
            std::__cxx11::string::_M_construct<char_const*>
                      (local_a48,(cx_string<2UL> *)&local_1288,
                       (long)((cx_string<2UL> *)&local_1288)->_data + sVar12);
            iVar11 = pthread_mutex_lock(ppVar2);
            if (iVar11 != 0) goto LAB_00108681;
            local_b18._0_8_ = ppVar2[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_b18,
                       (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
            uVar3 = ppVar2[3].__align;
            ppVar2[3].__align = uVar3 + 1;
            pthread_mutex_unlock(ppVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a80._M_p != local_1048) {
              operator_delete(local_a80._M_p,local_a70._M_allocated_capacity + 1);
            }
            if ((char *)local_b18._120_8_ != local_1088) {
              operator_delete((void *)local_b18._120_8_,local_b18._136_8_ + 1);
            }
            if ((undefined1 *)local_b18._80_8_ != local_b18 + 0x60) {
              operator_delete((void *)local_b18._80_8_,local_b18._96_8_ + 1);
            }
            if ((undefined1 *)local_b18._48_8_ != local_b18 + 0x40) {
              operator_delete((void *)local_b18._48_8_,local_b18._64_8_ + 1);
            }
            if ((undefined1 *)local_b18._16_8_ != local_b18 + 0x20) {
              operator_delete((void *)local_b18._16_8_,
                              CONCAT44(local_b18._36_4_,local_b18._32_4_) + 1);
            }
            LOCK();
            UNLOCK();
            _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
                 = uVar3;
          }
          uVar3 = 
          _ZZN12_GLOBAL__N_112readMetadataERSiRSt6vectorI15RecoveredBufferSaIS2_EEE11_binlog_sid_2_0
          ;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                       (string *)&local_1288);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1288._M_allocated_capacity != &local_1278) {
              operator_delete((void *)local_1288._M_allocated_capacity,
                              (ulong)(local_1278._M_allocated_capacity + 1));
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_1288._M_allocated_capacity = 0;
          local_1288._8_8_ = 0;
          clock_gettime(0,(timespec *)&local_1288);
          lVar20 = local_1288._M_allocated_capacity * 1000000000;
          local_1288._M_allocated_capacity =
               (size_type)
               (local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               -(long)local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
          name = &local_1030;
          binlog::SessionWriter::addEvent<unsigned_long,unsigned_long_const&>
                    (local_1198,uVar3,lVar20 + local_1288._8_8_,(unsigned_long *)&local_1288,
                     &name->_M_allocated_capacity);
        }
        anon_unknown.dwarf_1ed09::printLogs();
        local_1288._M_allocated_capacity = local_1288._M_allocated_capacity & 0xffffffff00000000;
        local_1288._8_8_ = local_1030._M_allocated_capacity;
        local_1278._M_allocated_capacity =
             (size_type)
             local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_1278._8_8_ =
             local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_1268 = local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::
        emplace_back<RecoveredBuffer>(&local_1068,(RecoveredBuffer *)&local_1288);
        if ((pointer)local_1278._M_allocated_capacity != (pointer)0x0) {
          operator_delete((void *)local_1278._M_allocated_capacity,
                          (long)local_1268 - local_1278._0_8_);
        }
        bVar8 = true;
LAB_0010666b:
        if (local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_10e8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (!bVar8) {
LAB_00106690:
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = &local_1258;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_1258._M_allocated_capacity != &local_1248) {
              operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar17 = binlog::default_session();
                name = &local_1258;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                           (string *)name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)local_1258._M_allocated_capacity != &local_1248) {
                  operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_c88._0_8_ = 0;
              local_c88._8_2_ = error;
              local_c78._M_p = (pointer)&local_c68;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c78,"main","");
              local_c58._M_p = (pointer)&local_c48;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c58,"main","");
              local_c38._M_p = (pointer)&local_c28;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c38,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,"");
              local_c18 = 0x125;
              local_c10._M_p = (pointer)local_1100;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c10,
                         "  Failed to read metadata, continue searching at tellg={}","");
              local_1258._M_allocated_capacity._0_2_ = 0x6c;
              local_bf0._M_allocated_capacity = (size_type)local_1108;
              sVar12 = strlen(local_1258._M_local_buf);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1168,&local_1258,local_1258._M_local_buf + sVar12);
              iVar11 = pthread_mutex_lock(ppVar2);
              if (iVar11 != 0) goto LAB_00108649;
              local_c88._0_8_ = ppVar2[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_c88,
                         (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
              _Var16._M_i = ppVar2[3].__align;
              ppVar2[3].__align = _Var16._M_i + 1;
              pthread_mutex_unlock(ppVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bf0._M_allocated_capacity != local_1108) {
                operator_delete((void *)local_bf0._M_allocated_capacity,
                                local_be0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c10._M_p != local_1100) {
                operator_delete(local_c10._M_p,local_c00._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c38._M_p != &local_c28) {
                operator_delete(local_c38._M_p,local_c28._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c58._M_p != &local_c48) {
                operator_delete(local_c58._M_p,local_c48._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c78._M_p != &local_c68) {
                operator_delete(local_c78._M_p,local_c68._M_allocated_capacity + 1);
              }
              LOCK();
              UNLOCK();
              main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
            }
            aVar4.super___atomic_base<unsigned_long>._M_i =
                 main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              name = &local_1258;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_1258._M_allocated_capacity != &local_1248) {
                operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1258._M_allocated_capacity = 0;
            local_1258._8_8_ = 0;
            clock_gettime(0,(timespec *)&local_1258);
            binlog::SessionWriter::addEvent<long_const&>
                      (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                       local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_,&local_10f0)
            ;
          }
          anon_unknown.dwarf_1ed09::printLogs();
          std::ios::clear((int)*(undefined8 *)(local_238[0] + -0x18) + iVar10);
LAB_0010694f:
          std::istream::seekg((istream *)local_238,local_10f0,0);
        }
      }
      else if (CONCAT44(uStack_106c,local_1070) == local_a28) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = &local_1258;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              name = &local_1258;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_1258._M_allocated_capacity != &local_1248) {
                operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_d40._0_8_ = 0;
            local_d40._8_2_ = info;
            local_d30._M_p = (pointer)&local_d20;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"main","");
            local_d10._M_p = (pointer)&local_d00;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"main","");
            local_cf0._M_p = (pointer)&local_ce0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_cf0,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,"");
            local_cd0 = 300;
            local_cc8._M_p = (pointer)local_1110;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_cc8,"Magic number found, read data at tellg={}","");
            local_1258._M_allocated_capacity._0_2_ = 0x6c;
            local_ca8._M_allocated_capacity = (size_type)local_10a8;
            sVar12 = strlen(local_1258._M_local_buf);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1178,&local_1258,local_1258._M_local_buf + sVar12);
            iVar11 = pthread_mutex_lock(ppVar2);
            if (iVar11 != 0) goto LAB_00108650;
            local_d40._0_8_ = ppVar2[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)local_d40,
                       (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
            _Var16._M_i = ppVar2[3].__align;
            ppVar2[3].__align = _Var16._M_i + 1;
            pthread_mutex_unlock(ppVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ca8._M_allocated_capacity != local_10a8) {
              operator_delete((void *)local_ca8._M_allocated_capacity,
                              local_c98._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cc8._M_p != local_1110) {
              operator_delete(local_cc8._M_p,local_cb8._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cf0._M_p != &local_ce0) {
              operator_delete(local_cf0._M_p,local_ce0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d10._M_p != &local_d00) {
              operator_delete(local_d10._M_p,local_d00._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d30._M_p != &local_d20) {
              operator_delete(local_d30._M_p,local_d20._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
          }
          aVar4.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            name = &local_1258;
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_1258._M_allocated_capacity != &local_1248) {
              operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_1258._M_allocated_capacity = 0;
          local_1258._8_8_ = 0;
          clock_gettime(0,(timespec *)&local_1258);
          binlog::SessionWriter::addEvent<long_const&>
                    (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                     local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_,&local_10f0);
        }
        anon_unknown.dwarf_1ed09::printLogs();
        bVar8 = anon_unknown.dwarf_1ed09::readData((istream *)local_238,&local_1068);
        if (!bVar8) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            name = &local_1258;
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_1258._M_allocated_capacity != &local_1248) {
              operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar17 = binlog::default_session();
                name = &local_1258;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                           (string *)name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)local_1258._M_allocated_capacity != &local_1248) {
                  operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_df8._0_8_ = 0;
              local_df8._8_2_ = error;
              local_de8._M_p = (pointer)&local_dd8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_de8,"main","");
              local_dc8._M_p = (pointer)&local_db8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc8,"main","");
              local_da8._M_p = (pointer)&local_d98;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_da8,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,"");
              local_d88 = 0x12f;
              local_d80._M_p = (pointer)local_1180;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d80,
                         "  Failed to read data, continue searching at tellg={}","");
              local_1258._M_allocated_capacity._0_2_ = 0x6c;
              local_d60._M_p = (pointer)local_1170;
              sVar12 = strlen(local_1258._M_local_buf);
              std::__cxx11::string::_M_construct<char_const*>
                        (local_a38,&local_1258,local_1258._M_local_buf + sVar12);
              iVar11 = pthread_mutex_lock(ppVar2);
              if (iVar11 != 0) goto LAB_0010866c;
              local_df8._0_8_ = ppVar2[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_df8,
                         (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
              _Var16._M_i = ppVar2[3].__align;
              ppVar2[3].__align = _Var16._M_i + 1;
              pthread_mutex_unlock(ppVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d60._M_p != local_1170) {
                operator_delete(local_d60._M_p,local_d50._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d80._M_p != local_1180) {
                operator_delete(local_d80._M_p,local_d70._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_da8._M_p != &local_d98) {
                operator_delete(local_da8._M_p,local_d98._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_dc8._M_p != &local_db8) {
                operator_delete(local_dc8._M_p,local_db8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_de8._M_p != &local_dd8) {
                operator_delete(local_de8._M_p,local_dd8._M_allocated_capacity + 1);
              }
              LOCK();
              UNLOCK();
              main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
            }
            aVar4.super___atomic_base<unsigned_long>._M_i =
                 main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              name = &local_1258;
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_1258._M_allocated_capacity != &local_1248) {
                operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1258._M_allocated_capacity = 0;
            local_1258._8_8_ = 0;
            clock_gettime(0,(timespec *)&local_1258);
            binlog::SessionWriter::addEvent<long_const&>
                      (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                       local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_,&local_10f0)
            ;
          }
          anon_unknown.dwarf_1ed09::printLogs();
          std::ios::clear((int)*(undefined8 *)(local_238[0] + -0x18) + iVar10);
          goto LAB_0010694f;
        }
      }
      else {
        std::istream::seekg((long)local_238,0xfffffff9);
      }
    }
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        name = &local_1258;
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1258._M_allocated_capacity != &local_1248) {
          operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
        if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar15 = binlog::default_thread_local_writer();
          pSVar17 = pSVar15->_session;
          local_5a8._0_8_ = 0;
          local_5a8._8_2_ = error;
          local_598._M_p = local_588;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"main","");
          local_578._M_p = local_568;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"main","");
          local_558._M_p = local_548;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_558,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,"");
          local_538 = 0x141;
          local_530._M_p = local_520;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_530,"Failure while reading input, continue anyway","");
          local_1258._M_allocated_capacity = local_1258._M_allocated_capacity & 0xffffffffffffff00;
          local_510._M_p = local_500;
          sVar12 = strlen(local_1258._M_local_buf);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_510,&local_1258,local_1258._M_local_buf + sVar12);
          _Var16._M_i = binlog::Session::addEventSource(pSVar17,(EventSource *)local_5a8);
          binlog::EventSource::~EventSource((EventSource *)local_5a8);
          LOCK();
          UNLOCK();
          main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
        }
        _Var16 = main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = &local_1258;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
LAB_00108466:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
LAB_00106e18:
        local_1258._M_allocated_capacity = 0;
        local_1258._8_8_ = 0;
        clock_gettime(0,(timespec *)&local_1258);
        binlog::SessionWriter::addEvent<>
                  (local_1198,_Var16._M_i,
                   local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_);
      }
    }
    else {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        name = &local_1258;
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1258._M_allocated_capacity != &local_1248) {
          operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
        if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar15 = binlog::default_thread_local_writer();
          pSVar17 = pSVar15->_session;
          local_4f0._0_8_ = 0;
          local_4f0._8_2_ = info;
          local_4e0._M_p = local_4d0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"main","");
          local_4c0._M_p = local_4b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"main","");
          local_4a0._M_p = local_490;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,"");
          local_480 = 0x13d;
          local_478._M_p = local_468;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_478,"Done reading input","");
          local_1258._M_allocated_capacity = local_1258._M_allocated_capacity & 0xffffffffffffff00;
          local_458._M_p = local_448;
          sVar12 = strlen(local_1258._M_local_buf);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_458,&local_1258,local_1258._M_local_buf + sVar12);
          _Var16._M_i = binlog::Session::addEventSource(pSVar17,(EventSource *)local_4f0);
          binlog::EventSource::~EventSource((EventSource *)local_4f0);
          LOCK();
          UNLOCK();
          main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
        }
        _Var16 = main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = &local_1258;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
          goto LAB_00108466;
        }
        goto LAB_00106e18;
      }
    }
    anon_unknown.dwarf_1ed09::printLogs();
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar17 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      name = &local_1258;
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           **)local_1258._M_allocated_capacity != &local_1248) {
        operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
      if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = &local_1258;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_718._0_8_ = 0;
        local_718._8_2_ = info;
        local_708._M_p = (pointer)&local_6f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"main","");
        local_6e8._M_p = (pointer)&local_6d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e8,"main","");
        local_6c8._M_p = (pointer)&local_6b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_6a8 = 0x144;
        local_6a0._M_p = (pointer)&local_690;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"Write output","");
        local_1258._M_allocated_capacity = local_1258._M_allocated_capacity & 0xffffffffffffff00;
        local_680._M_p = (pointer)&local_670;
        sVar12 = strlen(local_1258._M_local_buf);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_680,&local_1258,local_1258._M_local_buf + sVar12);
        iVar10 = pthread_mutex_lock(ppVar2);
        if (iVar10 != 0) {
LAB_0010868f:
          uVar18 = std::__throw_system_error(iVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::~vector(&local_1068);
          std::ofstream::~ofstream(local_438);
          if (local_960[0] != local_950) {
            operator_delete(local_960[0],local_950[0] + 1);
          }
          std::ifstream::~ifstream(local_238);
          _Unwind_Resume(uVar18);
        }
        local_718._0_8_ = ppVar2[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_718,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
        _Var16._M_i = ppVar2[3].__align;
        ppVar2[3].__align = _Var16._M_i + 1;
        pthread_mutex_unlock(ppVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_680._M_p != &local_670) {
          operator_delete(local_680._M_p,local_670._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6a0._M_p != &local_690) {
          operator_delete(local_6a0._M_p,local_690._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8._M_p != &local_6b8) {
          operator_delete(local_6c8._M_p,local_6b8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6e8._M_p != &local_6d8) {
          operator_delete(local_6e8._M_p,local_6d8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_708._M_p != &local_6f8) {
          operator_delete(local_708._M_p,local_6f8._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
      }
      aVar4.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        name = &local_1258;
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1258._M_allocated_capacity != &local_1248) {
          operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_1258._M_allocated_capacity = 0;
      local_1258._8_8_ = 0;
      clock_gettime(0,(timespec *)&local_1258);
      binlog::SessionWriter::addEvent<>
                (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                 local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_);
    }
    anon_unknown.dwarf_1ed09::printLogs();
    pRVar7 = local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pRVar6 = local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar24 = (long)local_1068.
                     super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1068.
                     super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar19 = (lVar24 >> 3) * -0x3333333333333333;
      lVar20 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar20 == 0; lVar20 = lVar20 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                (local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar20 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar24 < 0x281) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pRVar6,pRVar7);
      }
      else {
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)pRVar6 + 0x280);
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (pRVar6,paVar22);
        for (; paVar22 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pRVar7;
            paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar22 + 0x28)) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<RecoveredBuffer*,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                    ();
        }
      }
    }
    local_f68._0_8_ = 0;
    local_10a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    bVar8 = local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl
            .super__Vector_impl_data._M_start ==
            local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>._M_impl
            .super__Vector_impl_data._M_finish;
    if (bVar8) {
      iVar11 = 0;
    }
    else {
      local_1190 = &local_1000;
      local_1188 = &local_fe0;
      local_1168 = &local_fc0;
      local_10f8 = &local_f98;
      local_10a8 = &local_f88;
      local_1100 = &local_f78;
      local_1108 = &local_e28;
      local_1078 = &local_e18;
      local_1110 = &local_e08;
      local_1178 = &local_e90;
      local_1180 = &local_e70;
      local_1170 = &local_e50;
      iVar11 = 0;
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1068.super__Vector_base<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      do {
        paVar23 = &local_1258;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          name = paVar23;
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)paVar23);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
          if (main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i == 0) {
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                         (string *)paVar23);
              name = paVar23;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_1258._M_allocated_capacity != &local_1248) {
                operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
                name = paVar23;
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
            local_1020._M_allocated_capacity = 0;
            local_1020._8_2_ = 0x80;
            local_1010[0] = &local_1000;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1010,"main","");
            local_ff0[0] = &local_fe0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_ff0,"main","");
            local_fd0[0] = &local_fc0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_fd0,
                       "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                       ,"");
            local_fb0 = 0x150;
            local_fa8[0] = local_10f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_fa8,"Write {} bytes of recovered {} to output at offset {}",
                       "");
            local_b18._0_2_ = 0x4c;
            mserialize::CustomTag<BufferType,_void>::tag_string();
            local_1288._M_allocated_capacity._0_2_ = 0x4c;
            mserialize::cx_strcat<1ul,33ul,1ul>
                      ((cx_string<35UL> *)&local_1258,(mserialize *)local_b18,
                       (cx_string<1UL> *)local_a18,(cx_string<33UL> *)&local_1288,
                       (cx_string<1UL> *)name);
            local_f88._M_allocated_capacity = (size_type)local_1100;
            sVar12 = strlen(local_1258._M_local_buf);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_10a8,&local_1258,local_1258._M_local_buf + sVar12);
            iVar10 = pthread_mutex_lock(ppVar2);
            if (iVar10 != 0) goto LAB_00108642;
            local_1020._M_allocated_capacity = ppVar2[3].__align;
            binlog::
            serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                      ((EventSource *)&local_1020,
                       (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
            _Var16._M_i = ppVar2[3].__align;
            ppVar2[3].__align = _Var16._M_i + 1;
            pthread_mutex_unlock(ppVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f88._M_allocated_capacity != local_1100) {
              operator_delete((void *)local_f88._M_allocated_capacity,
                              local_f78._M_allocated_capacity + 1);
            }
            if (local_fa8[0] != local_10f8) {
              operator_delete(local_fa8[0],local_f98._M_allocated_capacity + 1);
            }
            if (local_fd0[0] != &local_fc0) {
              operator_delete(local_fd0[0],local_fc0._M_allocated_capacity + 1);
            }
            if (local_ff0[0] != &local_fe0) {
              operator_delete(local_ff0[0],local_fe0._M_allocated_capacity + 1);
            }
            if (local_1010[0] != &local_1000) {
              operator_delete(local_1010[0],local_1000._M_allocated_capacity + 1);
            }
            LOCK();
            UNLOCK();
            main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
          }
          aVar4.super___atomic_base<unsigned_long>._M_i =
               main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i;
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                       (string *)&local_1258);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_1258._M_allocated_capacity != &local_1248) {
              operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          local_1258._M_allocated_capacity = 0;
          local_1258._8_8_ = 0;
          clock_gettime(0,(timespec *)&local_1258);
          lVar20 = local_1258._M_allocated_capacity * 1000000000;
          local_1258._M_allocated_capacity =
               *(long *)(paVar22->_M_local_buf + 0x18) -
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(paVar22->_M_local_buf + 0x10))->_M_allocated_capacity;
          name = paVar22;
          binlog::SessionWriter::addEvent<unsigned_long,BufferType_const&,unsigned_long&>
                    (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                     lVar20 + local_1258._8_8_,&local_1258._M_allocated_capacity,
                     (BufferType *)&paVar22->_M_allocated_capacity,(unsigned_long *)local_f68);
        }
        paVar23 = &local_1258;
        anon_unknown.dwarf_1ed09::printLogs();
        std::ostream::write((char *)local_1098,
                            ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)(paVar22->_M_local_buf + 0x10))->_M_allocated_capacity);
        local_f68._0_8_ =
             *(long *)(paVar22->_M_local_buf + 0x18) +
             (local_f68._0_8_ -
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar22->_M_local_buf + 0x10))->_M_allocated_capacity);
        uVar1 = *(uint *)(local_1038 + *(long *)(*(long *)local_1098 + -0x18));
        if ((uVar1 & 5) != 0) {
          if ((char)in_FS_OFFSET[-1] == '\0') {
            pSVar17 = binlog::default_session();
            binlog::detail::this_thread_id_string_abi_cxx11_();
            binlog::SessionWriter::SessionWriter
                      ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)paVar23
                      );
            name = paVar23;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)local_1258._M_allocated_capacity != &local_1248) {
              operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
              name = paVar23;
            }
            __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                &__dso_handle);
            *(undefined1 *)(in_FS_OFFSET + -1) = 1;
          }
          if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
            if (main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i == 0) {
              if ((char)in_FS_OFFSET[-1] == '\0') {
                pSVar17 = binlog::default_session();
                name = &local_1258;
                binlog::detail::this_thread_id_string_abi_cxx11_();
                binlog::SessionWriter::SessionWriter
                          ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                           (string *)name);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     **)local_1258._M_allocated_capacity != &local_1248) {
                  operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
                }
                __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                    &__dso_handle);
                *(undefined1 *)(in_FS_OFFSET + -1) = 1;
              }
              ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
              local_eb0._0_8_ = 0;
              local_eb0._8_2_ = error;
              local_ea0._M_p = (pointer)&local_e90;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea0,"main","");
              local_e80._M_p = (pointer)&local_e70;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e80,"main","");
              local_e60._M_p = (pointer)&local_e50;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e60,
                         "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                         ,"");
              local_e40 = 0x156;
              local_e38._M_p = (pointer)local_1108;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e38,"Failure while writing output","");
              local_1258._M_allocated_capacity =
                   local_1258._M_allocated_capacity & 0xffffffffffffff00;
              local_e18._M_allocated_capacity = (size_type)local_1110;
              sVar12 = strlen(local_1258._M_local_buf);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1078,&local_1258,local_1258._M_local_buf + sVar12);
              iVar10 = pthread_mutex_lock(ppVar2);
              if (iVar10 != 0) goto LAB_00108657;
              local_eb0._0_8_ = ppVar2[3].__align;
              binlog::
              serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                        ((EventSource *)local_eb0,
                         (RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
              _Var16._M_i = ppVar2[3].__align;
              ppVar2[3].__align = _Var16._M_i + 1;
              pthread_mutex_unlock(ppVar2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e18._M_allocated_capacity != local_1110) {
                operator_delete((void *)local_e18._M_allocated_capacity,
                                local_e08._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e38._M_p != local_1108) {
                operator_delete(local_e38._M_p,local_e28._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e60._M_p != &local_e50) {
                operator_delete(local_e60._M_p,local_e50._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e80._M_p != &local_e70) {
                operator_delete(local_e80._M_p,local_e70._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ea0._M_p != &local_e90) {
                operator_delete(local_ea0._M_p,local_e90._M_allocated_capacity + 1);
              }
              LOCK();
              UNLOCK();
              main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
            }
            aVar4.super___atomic_base<unsigned_long>._M_i =
                 main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i;
            if ((char)in_FS_OFFSET[-1] == '\0') {
              pSVar17 = binlog::default_session();
              binlog::detail::this_thread_id_string_abi_cxx11_();
              name = &local_1258;
              binlog::SessionWriter::SessionWriter
                        ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                         (string *)&local_1258);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)local_1258._M_allocated_capacity != &local_1248) {
                operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
              }
              __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                                  &__dso_handle);
              *(undefined1 *)(in_FS_OFFSET + -1) = 1;
            }
            local_1258._M_allocated_capacity = 0;
            local_1258._8_8_ = 0;
            clock_gettime(0,(timespec *)&local_1258);
            binlog::SessionWriter::addEvent<>
                      (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                       local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_);
          }
          iVar11 = 4;
          anon_unknown.dwarf_1ed09::printLogs();
        }
        if ((uVar1 & 5) != 0) break;
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)paVar22 + 0x28);
        bVar8 = paVar22 == local_10a0;
      } while (!bVar8);
    }
    if (bVar8) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)&local_1258
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1258._M_allocated_capacity != &local_1248) {
          operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
        if (main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar15 = binlog::default_thread_local_writer();
          pSVar17 = pSVar15->_session;
          local_660._0_8_ = 0;
          local_660._8_2_ = info;
          local_650._M_p = local_640;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"main","");
          local_630._M_p = local_620;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"main","");
          local_610._M_p = local_600;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_610,
                     "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                     ,"");
          local_5f0 = 0x15c;
          local_5e8._M_p = local_5d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5e8,"Done writing output","");
          local_1258._M_allocated_capacity = local_1258._M_allocated_capacity & 0xffffffffffffff00;
          local_5c8._M_p = local_5b8;
          sVar12 = strlen(local_1258._M_local_buf);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_5c8,&local_1258,local_1258._M_local_buf + sVar12);
          _Var16._M_i = binlog::Session::addEventSource(pSVar17,(EventSource *)local_660);
          binlog::EventSource::~EventSource((EventSource *)local_660);
          LOCK();
          UNLOCK();
          main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
        }
        aVar4.super___atomic_base<unsigned_long>._M_i =
             main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i;
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                     (string *)&local_1258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        local_1258._M_allocated_capacity = 0;
        local_1258._8_8_ = 0;
        clock_gettime(0,(timespec *)&local_1258);
        binlog::SessionWriter::addEvent<>
                  (local_1198,(uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                   local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_);
      }
      iVar11 = 0;
      anon_unknown.dwarf_1ed09::printLogs();
    }
    std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::~vector(&local_1068);
  }
  else {
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar17 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)&local_1258);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           **)local_1258._M_allocated_capacity != &local_1248) {
        operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    lVar20 = *in_FS_OFFSET;
    if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x201) {
      if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
        if ((char)in_FS_OFFSET[-1] == '\0') {
          pSVar17 = binlog::default_session();
          binlog::detail::this_thread_id_string_abi_cxx11_();
          binlog::SessionWriter::SessionWriter
                    ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,
                     (string *)&local_1258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)local_1258._M_allocated_capacity != &local_1248) {
            operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
          }
          __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                              &__dso_handle);
          *(undefined1 *)(in_FS_OFFSET + -1) = 1;
        }
        ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
        local_888._0_8_ = 0;
        local_888._8_2_ = error;
        local_878._M_p = (pointer)&local_868;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"main","");
        local_858._M_p = (pointer)&local_848;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"main","");
        local_838._M_p = (pointer)&local_828;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_838,
                   "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/bin/brecovery.cpp"
                   ,"");
        local_818 = 0x108;
        local_810._M_p = (pointer)&local_800;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_810,"Failed to open {} for writing","");
        local_a18[0]._M_allocated_capacity._0_2_ = 0x5b;
        local_f68._0_2_ = 99;
        cVar9 = mserialize::cx_strcat<1ul,1ul>
                          ((cx_string<1UL> *)local_a18,(cx_string<1UL> *)local_f68);
        local_1258._M_allocated_capacity =
             CONCAT53(local_1258._M_allocated_capacity._3_5_,cVar9._data) & 0xffffffffff00ffff;
        local_7f0._M_p = (pointer)&local_7e0;
        sVar12 = strlen(local_1258._M_local_buf);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_7f0,&local_1258,local_1258._M_local_buf + sVar12);
        iVar10 = pthread_mutex_lock(ppVar2);
        if (iVar10 != 0) goto LAB_0010867a;
        local_888._0_8_ = ppVar2[3].__align;
        binlog::
        serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                  ((EventSource *)local_888,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
        _Var16._M_i = ppVar2[3].__align;
        ppVar2[3].__align = _Var16._M_i + 1;
        pthread_mutex_unlock(ppVar2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_p != &local_7e0) {
          operator_delete(local_7f0._M_p,local_7e0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_p != &local_800) {
          operator_delete(local_810._M_p,local_800._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_838._M_p != &local_828) {
          operator_delete(local_838._M_p,local_828._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_p != &local_848) {
          operator_delete(local_858._M_p,local_848._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_878._M_p != &local_868) {
          operator_delete(local_878._M_p,local_868._M_allocated_capacity + 1);
        }
        LOCK();
        UNLOCK();
        main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var16._M_i;
      }
      aVar4.super___atomic_base<unsigned_long>._M_i =
           main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar17 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar17,0x100000,0,(string *)&local_1258
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             **)local_1258._M_allocated_capacity != &local_1248) {
          operator_delete((void *)local_1258._M_allocated_capacity,(long)local_1248 + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      local_1258._M_allocated_capacity = 0;
      local_1258._8_8_ = 0;
      clock_gettime(0,(timespec *)&local_1258);
      binlog::SessionWriter::addEvent<char_const*&>
                ((SessionWriter *)(lVar20 + -0x38),
                 (uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
                 local_1258._M_allocated_capacity * 1000000000 + local_1258._8_8_,argv + 2);
    }
    anon_unknown.dwarf_1ed09::printLogs();
    iVar11 = 3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
               ,0x2cd);
  }
  local_438 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_438 + *(long *)(_VTT->_M_local_buf + -0x18)) = _strftime;
  std::filebuf::~filebuf((filebuf *)&sStack_430);
  std::ios_base::~ios_base(local_340);
  if (local_960[0] != local_950) {
    operator_delete(local_960[0],local_950[0] + 1);
  }
LAB_00107d4b:
  std::ifstream::~ifstream(local_238);
  return iVar11;
LAB_00108642:
  iVar11 = std::__throw_system_error(iVar10);
LAB_00108649:
  iVar11 = std::__throw_system_error(iVar11);
LAB_00108650:
  iVar10 = std::__throw_system_error(iVar11);
LAB_00108657:
  iVar11 = std::__throw_system_error(iVar10);
LAB_0010865e:
  iVar10 = std::__throw_system_error(iVar11);
LAB_00108665:
  iVar11 = std::__throw_system_error(iVar10);
LAB_0010866c:
  iVar11 = std::__throw_system_error(iVar11);
LAB_00108673:
  iVar10 = std::__throw_system_error(iVar11);
LAB_0010867a:
  iVar11 = std::__throw_system_error(iVar10);
LAB_00108681:
  iVar10 = std::__throw_system_error(iVar11);
LAB_00108688:
  iVar10 = std::__throw_system_error(iVar10);
  goto LAB_0010868f;
}

Assistant:

int main(int argc, const char* argv[])
{
  if (argc < 2)
  {
    showHelp();
    return 1;
  }

  std::ifstream input(argv[1], std::ios_base::in|std::ios_base::binary);
  if (! input)
  {
    STDERR_ERROR("Failed to open {} for reading", argv[1]);
    showHelp();
    return 2;
  }

  const std::string outputPath = (argc > 2) ? argv[2] : "-";
  std::ofstream outputFile;
  std::ostream& output = openFile(outputPath, outputFile);
  if (! output)
  {
    STDERR_ERROR("Failed to open {} for writing", argv[2]);
    showHelp();
    return 3;
  }

  std::vector<RecoveredBuffer> buffers;

  // do not initialize arrays directly to remain endianness agnostic
  const std::array<unsigned char, 8> metadataMagic = toArray(0xFE214F726E35BDBC);
  const std::array<unsigned char, 8> dataMagic = toArray(0xFE213F716D34BCBC);

  // magic numbers start with the same byte, makes searching easier
  assert(metadataMagic[0] == dataMagic[0]);
  const unsigned char firstMagicByte = metadataMagic[0];

  STDERR_INFO("Read input from {}", argv[1]);

  while (input.ignore(std::numeric_limits<std::streamsize>::max(), firstMagicByte).good())
  {
    std::array<unsigned char, 8> magic{firstMagicByte, 0, 0, 0, 0, 0, 0, 0};
    input.read(reinterpret_cast<char*>(magic.data()+1), 7);

    const auto afterMagicPos = std::streamoff{input.tellg()};

    if (magic == metadataMagic)
    {
      STDERR_INFO("Magic number found, read metadata at tellg={}", afterMagicPos);
      if (! readMetadata(input, buffers))
      {
        STDERR_ERROR("  Failed to read metadata, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else if (magic == dataMagic)
    {
      STDERR_INFO("Magic number found, read data at tellg={}", afterMagicPos);
      if (! readData(input, buffers))
      {
        STDERR_ERROR("  Failed to read data, continue searching at tellg={}", afterMagicPos);
        input.clear();
        input.seekg(afterMagicPos);
      }
    }
    else
    {
      // not a magic number, seek back
      input.seekg(-7, std::ios_base::cur);
    }
  }

  if (input.eof())
  {
    STDERR_INFO("Done reading input");
  }
  else
  {
    STDERR_ERROR("Failure while reading input, continue anyway");
  }

  STDERR_INFO("Write output");

  // make sure metadata precedes data, and everything is grouped by sessions
  const auto cmp = [](auto&& a, auto&& b)
  {
    return a.session == b.session ? a.type < b.type : a.session < b.session;
  };
  std::sort(buffers.begin(), buffers.end(), cmp);

  std::size_t offset = 0;
  for (const RecoveredBuffer& buffer : buffers)
  {
    STDERR_INFO("Write {} bytes of recovered {} to output at offset {}", buffer.buffer.size(), buffer.type, offset);
    output.write(buffer.buffer.data(), std::streamsize(buffer.buffer.size()));
    offset += buffer.buffer.size();

    if (! output)
    {
      STDERR_ERROR("Failure while writing output");
      return 4;

    }
  }

  STDERR_INFO("Done writing output");

  return 0;
}